

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_token_stream.c
# Opt level: O3

void l2_token_stream_destroy(l2_token_stream *token_stream_p)

{
  l2_assert_func((long)token_stream_p,L2_INTERNAL_ERROR_NULL_POINTER,"l2_token_stream_destroy",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_token_stream.c"
                 ,0x23);
  l2_vector_destroy(&token_stream_p->token_vector);
  token_stream_p->token_vector_current_pos = 0;
  l2_char_stream_destroy(token_stream_p->char_stream_p);
  free(token_stream_p);
  return;
}

Assistant:

void l2_token_stream_destroy(l2_token_stream *token_stream_p) {
    l2_assert(token_stream_p, L2_INTERNAL_ERROR_NULL_POINTER);
    /*
    int i;
    l2_token *tp;
    for (i = 0; i < token_stream_p->token_vector.size; i++) {
        tp = (l2_token *)l2_vector_at(&token_stream_p->token_vector, i);
        l2_assert(tp, L2_INTERNAL_ERROR_NULL_POINTER);
        if (tp->type == L2_TOKEN_IDENTIFIER || tp->type == L2_TOKEN_STRING_LITERAL)
            l2_string_destroy(&tp->u.str);
    }
    */
    l2_vector_destroy(&token_stream_p->token_vector);
    token_stream_p->token_vector_current_pos = 0;
    l2_char_stream_destroy(token_stream_p->char_stream_p);
    free(token_stream_p);
}